

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void P_BringUpWeapon(player_t *player)

{
  AActor *ent;
  int iVar1;
  DPSprite *pDVar2;
  FState *state;
  AWeapon *pAVar3;
  AInventory *pAVar4;
  undefined4 extraout_var;
  double local_38;
  FSoundID local_1c;
  AWeapon *local_18;
  AWeapon *weapon;
  player_t *player_local;
  
  weapon = (AWeapon *)player;
  if (player->PendingWeapon == (AWeapon *)0xffffffffffffffff) {
    if (player->ReadyWeapon != (AWeapon *)0x0) {
      pDVar2 = player_t::GetPSprite(player,PSP_WEAPON);
      pAVar3 = weapon;
      pDVar2->y = 32.375;
      state = (FState *)
              (**(code **)(**(long **)&(weapon->super_AInventory).super_AActor.sprite + 0x230))();
      P_SetPsprite((player_t *)pAVar3,PSP_WEAPON,state,false);
    }
  }
  else {
    local_18 = player->PendingWeapon;
    if ((((local_18 != (AWeapon *)0x0) &&
         (pAVar3 = TObjPtr::operator_cast_to_AWeapon_((TObjPtr *)&local_18->SisterWeapon),
         pAVar3 != (AWeapon *)0x0)) &&
        (pAVar3 = TObjPtr<AWeapon>::operator->(&local_18->SisterWeapon),
        (*(uint *)&(pAVar3->super_AInventory).field_0x4dc & 0x400) != 0)) &&
       (pAVar4 = AActor::FindInventory
                           ((AActor *)
                            (weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.
                            _vptr_DObject,
                            (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true),
       pAVar4 != (AInventory *)0x0)) {
      local_18 = TObjPtr::operator_cast_to_AWeapon_((TObjPtr *)&local_18->SisterWeapon);
    }
    (weapon->super_AInventory).super_AActor.Scale.X = -NAN;
    *(AWeapon **)&(weapon->super_AInventory).super_AActor.sprite = local_18;
    *(undefined4 *)
     ((weapon->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject + 0x39) = 0
    ;
    if (local_18 != (AWeapon *)0x0) {
      iVar1 = FSoundID::operator_cast_to_int(&(local_18->UpSound).super_FSoundID);
      if (iVar1 != 0) {
        ent = (AActor *)
              (weapon->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject;
        FSoundID::FSoundID(&local_1c,&(local_18->UpSound).super_FSoundID);
        S_Sound(ent,1,&local_1c,1.0,1.0);
      }
      *(undefined2 *)&(weapon->super_AInventory).super_AActor.picnum.texnum = 0;
      local_38 = 32.375;
      if (((weapon->super_AInventory).super_AActor.RenderStyle.AsDWORD & 0x800) == 0) {
        local_38 = 128.0;
      }
      pDVar2 = player_t::GetPSprite((player_t *)weapon,PSP_WEAPON);
      pDVar2->y = local_38;
      P_SetPsprite((player_t *)weapon,PSP_FLASH,(FState *)0x0,false);
      pAVar3 = weapon;
      iVar1 = (*(local_18->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject
                [0x44])();
      P_SetPsprite((player_t *)pAVar3,PSP_WEAPON,(FState *)CONCAT44(extraout_var,iVar1),false);
    }
  }
  return;
}

Assistant:

void P_BringUpWeapon (player_t *player)
{
	AWeapon *weapon;

	if (player->PendingWeapon == WP_NOCHANGE)
	{
		if (player->ReadyWeapon != nullptr)
		{
			player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
		return;
	}

	weapon = player->PendingWeapon;

	// If the player has a tome of power, use this weapon's powered up
	// version, if one is available.
	if (weapon != nullptr &&
		weapon->SisterWeapon &&
		weapon->SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		weapon = weapon->SisterWeapon;
	}

	player->PendingWeapon = WP_NOCHANGE;
	player->ReadyWeapon = weapon;
	player->mo->weaponspecial = 0;

	if (weapon != nullptr)
	{
		if (weapon->UpSound)
		{
			S_Sound (player->mo, CHAN_WEAPON, weapon->UpSound, 1, ATTN_NORM);
		}
		player->refire = 0;

		player->GetPSprite(PSP_WEAPON)->y = player->cheats & CF_INSTANTWEAPSWITCH
			? WEAPONTOP : WEAPONBOTTOM;
		// make sure that the previous weapon's flash state is terminated.
		// When coming here from a weapon drop it may still be active.
		P_SetPsprite(player, PSP_FLASH, nullptr);
		P_SetPsprite(player, PSP_WEAPON, weapon->GetUpState());
	}
}